

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GLMClassifier.pb.cc
# Opt level: O2

void __thiscall
CoreML::Specification::GLMClassifier::InternalSwap(GLMClassifier *this,GLMClassifier *other)

{
  uint32_t uVar1;
  intptr_t iVar2;
  ClassLabelsUnion CVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  
  iVar2 = (this->super_MessageLite)._internal_metadata_.ptr_;
  (this->super_MessageLite)._internal_metadata_.ptr_ =
       (other->super_MessageLite)._internal_metadata_.ptr_;
  (other->super_MessageLite)._internal_metadata_.ptr_ = iVar2;
  google::protobuf::internal::RepeatedPtrFieldBase::InternalSwap
            (&(this->weights_).super_RepeatedPtrFieldBase,
             &(other->weights_).super_RepeatedPtrFieldBase);
  google::protobuf::RepeatedField<double>::InternalSwap(&this->offset_,&other->offset_);
  iVar5 = this->postevaluationtransform_;
  iVar6 = this->classencoding_;
  iVar4 = other->classencoding_;
  this->postevaluationtransform_ = other->postevaluationtransform_;
  this->classencoding_ = iVar4;
  other->postevaluationtransform_ = iVar5;
  other->classencoding_ = iVar6;
  CVar3 = this->ClassLabels_;
  this->ClassLabels_ = other->ClassLabels_;
  other->ClassLabels_ = CVar3;
  uVar1 = this->_oneof_case_[0];
  this->_oneof_case_[0] = other->_oneof_case_[0];
  other->_oneof_case_[0] = uVar1;
  return;
}

Assistant:

void GLMClassifier::InternalSwap(GLMClassifier* other) {
  using std::swap;
  _internal_metadata_.InternalSwap(&other->_internal_metadata_);
  weights_.InternalSwap(&other->weights_);
  offset_.InternalSwap(&other->offset_);
  ::PROTOBUF_NAMESPACE_ID::internal::memswap<
      PROTOBUF_FIELD_OFFSET(GLMClassifier, classencoding_)
      + sizeof(GLMClassifier::classencoding_)
      - PROTOBUF_FIELD_OFFSET(GLMClassifier, postevaluationtransform_)>(
          reinterpret_cast<char*>(&postevaluationtransform_),
          reinterpret_cast<char*>(&other->postevaluationtransform_));
  swap(ClassLabels_, other->ClassLabels_);
  swap(_oneof_case_[0], other->_oneof_case_[0]);
}